

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

ValuedAction despot::AEMS::OptimalAction(VNode *vnode)

{
  ACT_TYPE _action;
  ulong uVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  size_type sVar2;
  double dVar3;
  ValuedAction VVar4;
  VNode *local_40;
  double local_38;
  QNode *local_30;
  QNode *qnode;
  VNode *pVStack_20;
  ACT_TYPE action;
  VNode *vnode_local;
  ValuedAction astar;
  
  pVStack_20 = vnode;
  ValuedAction::ValuedAction((ValuedAction *)&vnode_local,-1,-INFINITY);
  qnode._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)qnode._4_4_;
    this = VNode::children(pVStack_20);
    sVar2 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this);
    if (sVar2 <= uVar1) break;
    local_30 = VNode::Child(pVStack_20,qnode._4_4_);
    dVar3 = QNode::lower_bound(local_30);
    _action = qnode._4_4_;
    if ((double)astar._0_8_ < dVar3) {
      dVar3 = QNode::lower_bound(local_30);
      ValuedAction::ValuedAction((ValuedAction *)&local_40,_action,dVar3);
      vnode_local = local_40;
      astar._0_8_ = local_38;
    }
    qnode._4_4_ = qnode._4_4_ + 1;
  }
  VVar4._0_8_ = (ulong)vnode_local & 0xffffffff;
  VVar4.value = (double)astar._0_8_;
  return VVar4;
}

Assistant:

ValuedAction AEMS::OptimalAction(const VNode* vnode) {
	ValuedAction astar(-1, Globals::NEG_INFTY);
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		const QNode* qnode = vnode->Child(action);
		if (qnode->lower_bound() > astar.value) {
			astar = ValuedAction(action, qnode->lower_bound());
		}
	}
	return astar;
}